

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96ParamsStd(bign_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  undefined4 local_4;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    iVar2 = strCmp(in_RDI,in_RSI);
    if (iVar2 == 0) {
      in_RDI[0] = '`';
      in_RDI[1] = '\0';
      in_RDI[2] = '\0';
      in_RDI[3] = '\0';
      in_RDI[4] = '\0';
      in_RDI[5] = '\0';
      in_RDI[6] = '\0';
      in_RDI[7] = '\0';
      memCopy(in_RDI,in_RSI,0x148fad);
      memCopy(in_RDI,in_RSI,0x148fc7);
      memCopy(in_RDI,in_RSI,0x148fe4);
      memCopy(in_RDI,in_RSI,0x149001);
      memCopy(in_RDI,in_RSI,0x14901e);
      memCopy(in_RDI,in_RSI,0x14903b);
      local_4 = 0;
    }
    else {
      local_4 = 0xca;
    }
  }
  return local_4;
}

Assistant:

err_t bign96ParamsStd(bign_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (strEq(name, _curve96v1_name))
	{
		params->l = 96;
		memCopy(params->p, _curve96v1_p, 24);
		memCopy(params->a, _curve96v1_a, 24);
		memCopy(params->seed, _curve96v1_seed, 8);
		memCopy(params->b, _curve96v1_b, 24);
		memCopy(params->q, _curve96v1_q, 24);
		memCopy(params->yG, _curve96v1_yG, 24);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}